

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

TypeError * __thiscall ExpressionContext::GetErrorType(ExpressionContext *this)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  TypeError *pTVar3;
  
  iVar1 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x60);
  pTVar3 = (TypeError *)CONCAT44(extraout_var,iVar1);
  (pTVar3->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_003f6098;
  (pTVar3->super_TypeBase).typeID = 0;
  (pTVar3->super_TypeBase).name.begin = "%error-type%";
  (pTVar3->super_TypeBase).name.end = "";
  (pTVar3->super_TypeBase).arrayTypes.head = (TypeHandle *)0x0;
  (pTVar3->super_TypeBase).arrayTypes.tail = (TypeHandle *)0x0;
  uVar2 = NULLC::GetStringHash("%error-type%","");
  (pTVar3->super_TypeBase).nameHash = uVar2;
  (pTVar3->super_TypeBase).importModule = (ModuleData *)0x0;
  (pTVar3->super_TypeBase).typeIndex = 0xffffffff;
  (pTVar3->super_TypeBase).refType = (TypeRef *)0x0;
  (pTVar3->super_TypeBase).unsizedArrayType = (TypeUnsizedArray *)0x0;
  *(undefined8 *)&(pTVar3->super_TypeBase).alignment = 0;
  *(undefined8 *)((long)&(pTVar3->super_TypeBase).size + 4) = 0;
  *(undefined4 *)((long)&(pTVar3->super_TypeBase).padding + 3) = 0;
  (pTVar3->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_003f6050;
  return pTVar3;
}

Assistant:

ScopeData* NamedOrGlobalScopeFrom(ScopeData *scope)
	{
		if(!scope || scope->ownerNamespace || scope->scope == NULL)
			return scope;

		return NamedOrGlobalScopeFrom(scope->scope);
	}